

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedObjectFile.cpp
# Opt level: O0

shared_ptr<Form> __thiscall
LinkedObjectFile::to_form_script_object
          (LinkedObjectFile *this,int seg,int byte_idx,vector<bool,_std::allocator<bool>_> *seen)

{
  bool bVar1;
  uint uVar2;
  reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  undefined8 uVar6;
  uint in_ECX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  LinkedObjectFile *in_RDI;
  shared_ptr<Form> sVar8;
  string debug;
  int offset;
  value_type *word;
  shared_ptr<Form> *result;
  SymbolTable *in_stack_fffffffffffffea8;
  vector<Label,_std::allocator<Label>_> *in_stack_fffffffffffffeb0;
  LinkedObjectFile *this_00;
  string local_108 [64];
  string local_c8 [40];
  int in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  LinkedObjectFile *in_stack_ffffffffffffff68;
  string local_80 [8];
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  LinkedObjectFile *in_stack_ffffffffffffff98;
  LinkedObjectFile *in_stack_ffffffffffffffa0;
  
  this_00 = in_RDI;
  std::shared_ptr<Form>::shared_ptr((shared_ptr<Form> *)0x1ad894);
  uVar2 = in_ECX & 7;
  if ((uVar2 != 0) && ((uVar2 == 2 || (uVar2 != 4)))) {
    printf("align %d\n",(ulong)(in_ECX & 7));
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFile.cpp"
                  ,0x328,
                  "std::shared_ptr<Form> LinkedObjectFile::to_form_script_object(int, int, std::vector<bool> &)"
                 );
  }
  pvVar3 = std::
           vector<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
           ::at((vector<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                 *)in_stack_fffffffffffffeb0,(size_type)in_stack_fffffffffffffea8);
  pvVar4 = std::vector<LinkedWord,_std::allocator<LinkedWord>_>::at
                     ((vector<LinkedWord,_std::allocator<LinkedWord>_> *)in_stack_fffffffffffffeb0,
                      (size_type)in_stack_fffffffffffffea8);
  if (pvVar4->kind == SYM_PTR) {
    toForm((string *)this_00);
    std::shared_ptr<Form>::operator=
              ((shared_ptr<Form> *)in_stack_fffffffffffffeb0,
               (shared_ptr<Form> *)in_stack_fffffffffffffea8);
    std::shared_ptr<Form>::~shared_ptr((shared_ptr<Form> *)0x1ad95d);
    _Var7._M_pi = extraout_RDX;
  }
  else if (pvVar4->kind == PLAIN_DATA) {
    std::__cxx11::to_string((uint)((ulong)this_00 >> 0x20));
    toForm((string *)this_00);
    std::shared_ptr<Form>::operator=
              ((shared_ptr<Form> *)in_stack_fffffffffffffeb0,
               (shared_ptr<Form> *)in_stack_fffffffffffffea8);
    std::shared_ptr<Form>::~shared_ptr((shared_ptr<Form> *)0x1ad9dc);
    std::__cxx11::string::~string(local_80);
    _Var7._M_pi = extraout_RDX_00;
  }
  else if (pvVar4->kind == PTR) {
    pvVar5 = std::vector<Label,_std::allocator<Label>_>::at
                       (in_stack_fffffffffffffeb0,(size_type)in_stack_fffffffffffffea8);
    if ((pvVar5->offset & 7U) == 2) {
      to_form_script(in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,in_stack_ffffffffffffff90,
                     in_stack_ffffffffffffff88);
      std::shared_ptr<Form>::operator=
                ((shared_ptr<Form> *)in_stack_fffffffffffffeb0,
                 (shared_ptr<Form> *)in_stack_fffffffffffffea8);
      std::shared_ptr<Form>::~shared_ptr((shared_ptr<Form> *)0x1adabd);
      _Var7._M_pi = extraout_RDX_01;
    }
    else {
      bVar1 = is_string(this_00,(int)((ulong)pvVar3 >> 0x20),(int)pvVar3);
      if (bVar1) {
        get_goal_string_abi_cxx11_
                  (in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,in_stack_ffffffffffffff60);
        toForm((string *)this_00);
        std::shared_ptr<Form>::operator=
                  ((shared_ptr<Form> *)in_stack_fffffffffffffeb0,
                   (shared_ptr<Form> *)in_stack_fffffffffffffea8);
        std::shared_ptr<Form>::~shared_ptr((shared_ptr<Form> *)0x1adb54);
        std::__cxx11::string::~string(local_c8);
        _Var7._M_pi = extraout_RDX_02;
      }
      else {
        pvVar5 = std::vector<Label,_std::allocator<Label>_>::at
                           (in_stack_fffffffffffffeb0,(size_type)in_stack_fffffffffffffea8);
        toForm((string *)this_00);
        std::shared_ptr<Form>::operator=
                  ((shared_ptr<Form> *)pvVar5,(shared_ptr<Form> *)in_stack_fffffffffffffea8);
        std::shared_ptr<Form>::~shared_ptr((shared_ptr<Form> *)0x1adbe0);
        _Var7._M_pi = extraout_RDX_03;
      }
    }
  }
  else {
    if (pvVar4->kind != EMPTY_PTR) {
      std::__cxx11::string::string(local_108);
      append_word_to_string
                (in_stack_ffffffffffffffa0,(string *)in_stack_ffffffffffffff98,
                 (LinkedWord *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      uVar6 = std::__cxx11::string::c_str();
      printf("don\'t know how to print %s\n",uVar6);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFile.cpp"
                    ,800,
                    "std::shared_ptr<Form> LinkedObjectFile::to_form_script_object(int, int, std::vector<bool> &)"
                   );
    }
    SymbolTable::getEmptyPair(in_stack_fffffffffffffea8);
    std::shared_ptr<Form>::operator=
              ((shared_ptr<Form> *)in_stack_fffffffffffffeb0,
               (shared_ptr<Form> *)in_stack_fffffffffffffea8);
    std::shared_ptr<Form>::~shared_ptr((shared_ptr<Form> *)0x1adc20);
    _Var7._M_pi = extraout_RDX_04;
  }
  sVar8.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var7._M_pi;
  sVar8.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)in_RDI;
  return (shared_ptr<Form>)sVar8.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Form> LinkedObjectFile::to_form_script_object(int seg,
                                                              int byte_idx,
                                                              std::vector<bool>& seen) {
  std::shared_ptr<Form> result;

  switch (byte_idx & 7) {
    case 0:
    case 4: {
      auto& word = words_by_seg.at(seg).at(byte_idx / 4);
      if (word.kind == LinkedWord::SYM_PTR) {
        // .symbol xxxx
        result = toForm(word.symbol_name);
      } else if (word.kind == LinkedWord::PLAIN_DATA) {
        // .word xxxxx
        result = toForm(std::to_string(word.data));
      } else if (word.kind == LinkedWord::PTR) {
        // might be a sub-list, or some other random pointer
        auto offset = labels.at(word.label_id).offset;
        if ((offset & 7) == 2) {
          // list!
          result = to_form_script(seg, offset / 4, seen);
        } else {
          if (is_string(seg, offset)) {
            result = toForm(get_goal_string(seg, offset / 4 - 1));
          } else {
            // some random pointer, just print the label.
            result = toForm(labels.at(word.label_id).name);
          }
        }
      } else if (word.kind == LinkedWord::EMPTY_PTR) {
        result = gSymbolTable.getEmptyPair();
      } else {
        std::string debug;
        append_word_to_string(debug, word);
        printf("don't know how to print %s\n", debug.c_str());
        assert(false);
      }
    } break;

    case 2:  // bad, a pair snuck through.
    default:
      // pointers should be aligned!
      printf("align %d\n", byte_idx & 7);
      assert(false);
  }

  return result;
}